

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLDST4Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t in_ESI;
  uint size;
  uint load;
  undefined4 local_34;
  undefined4 local_4;
  
  uVar1 = fieldFromInstruction_4(in_ESI,6,2);
  if (uVar1 == 3) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction_4(in_ESI,0x15,1);
    if (uVar1 == 0) {
      local_34 = DecodeVSTInstruction(Inst,Insn,Address,Decoder);
    }
    else {
      local_34 = DecodeVLDInstruction(Inst,Insn,Address,Decoder);
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVLDST4Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}